

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

void __thiscall
helics::ValueFederateManager::addAlias
          (ValueFederateManager *this,Input *inp,string_view shortcutName)

{
  string_view message;
  bool bVar1;
  undefined8 uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RDI;
  handle inpHandle;
  InterfaceHandle *in_stack_ffffffffffffff18;
  Interface *in_stack_ffffffffffffff20;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>
  *in_stack_ffffffffffffff28;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff30;
  long *plVar3;
  size_t in_stack_ffffffffffffff38;
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  *this_00;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  *in_stack_ffffffffffffff58;
  pointer in_stack_ffffffffffffff60;
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_ffffffffffffff68;
  string_view in_stack_ffffffffffffff70;
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  __sv_type local_30;
  undefined8 local_10;
  undefined8 uStack_8;
  
  local_10 = in_RDX;
  uStack_8 = in_RCX;
  bVar1 = Interface::isValid((Interface *)0x299641);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    message._M_str = in_RDI;
    message._M_len = in_stack_ffffffffffffff38;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_ffffffffffffff30,message);
    __cxa_throw(uVar2,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  plVar3 = *(long **)(in_RDI + 0x200);
  Interface::getName_abi_cxx11_(in_stack_ffffffffffffff20);
  local_30 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_ffffffffffffff20);
  local_48 = (undefined4)local_10;
  uStack_44 = local_10._4_4_;
  uStack_40 = (undefined4)uStack_8;
  uStack_3c = uStack_8._4_4_;
  (**(code **)(*plVar3 + 0x228))(plVar3,local_30._M_len,local_30._M_str,local_10,uStack_8);
  this_00 = &local_60;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(in_stack_ffffffffffffff58);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::operator->(this_00);
  gmlc::containers::
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::
  addSearchTerm(in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,
                (InterfaceHandle *)in_stack_ffffffffffffff60);
  gmlc::libguarded::
  shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
  ::lock((shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
          *)in_stack_ffffffffffffff58);
  gmlc::libguarded::
  lock_handle<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
  ::operator->((lock_handle<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
                *)&stack0xffffffffffffff60);
  std::
  multimap<std::__cxx11::string,helics::InterfaceHandle,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>
  ::emplace<std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle_const&>
            (in_stack_ffffffffffffff28,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  gmlc::libguarded::
  lock_handle<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
  ::~lock_handle((lock_handle<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
                  *)0x29976c);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                  *)0x299779);
  return;
}

Assistant:

void ValueFederateManager::addAlias(const Input& inp, std::string_view shortcutName)
{
    if (inp.isValid()) {
        coreObject->addAlias(inp.getName(), shortcutName);
        auto inpHandle = inputs.lock();
        inpHandle->addSearchTerm(shortcutName, inp.handle);
        targetIDs.lock()->emplace(shortcutName, inp.handle);
    } else {
        throw(InvalidIdentifier("input is invalid"));
    }
}